

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

natwm_error config_item_create(parser *parser,map *config_map)

{
  config_value *local_38;
  config_value *item;
  char *key;
  map *pmStack_20;
  natwm_error err;
  map *config_map_local;
  parser *parser_local;
  
  key._4_4_ = 0x20;
  item = (config_value *)0x0;
  local_38 = (config_value *)0x0;
  pmStack_20 = config_map;
  config_map_local = (map *)parser;
  key._4_4_ = parser_read_item(parser,(char **)&item,&local_38);
  parser_local._4_4_ = key._4_4_;
  if (key._4_4_ == NO_ERROR) {
    key._4_4_ = map_insert(pmStack_20,item,local_38);
    if (key._4_4_ == NO_ERROR) {
      parser_local._4_4_ = NO_ERROR;
    }
    else {
      free(item);
      config_value_destroy(local_38);
      parser_local._4_4_ = key._4_4_;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum natwm_error config_item_create(struct parser *parser, struct map *config_map)
{
        enum natwm_error err = GENERIC_ERROR;
        char *key = NULL;
        struct config_value *item = NULL;

        err = parser_read_item(parser, &key, &item);

        if (err != NO_ERROR) {
                return err;
        }

        err = map_insert(config_map, key, item);

        if (err != NO_ERROR) {
                free(key);

                config_value_destroy(item);

                return err;
        }

        return NO_ERROR;
}